

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O1

int __thiscall deqp::gls::MemoryStressCase::init(MemoryStressCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  bool bVar1;
  undefined7 extraout_var;
  NotSupportedError *this_01;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  bVar1 = tcu::CommandLine::isOutOfMemoryTestEnabled
                    (((this->super_TestCase).super_TestNode.m_testCtx)->m_cmdLine);
  if (bVar1) {
    return (int)CONCAT71(extraout_var,bVar1);
  }
  local_1a0._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Tests that exhaust memory are disabled, use --deqp-test-oom=enable command line option to enable."
             ,0x61);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_128);
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_1a0._0_8_ = local_1a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"OOM tests disabled","");
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1a0);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MemoryStressCase::init (void)
{
	if (!m_testCtx.getCommandLine().isOutOfMemoryTestEnabled())
	{
		m_testCtx.getLog() << TestLog::Message << "Tests that exhaust memory are disabled, use --deqp-test-oom=enable command line option to enable." << TestLog::EndMessage;
		throw tcu::NotSupportedError("OOM tests disabled");
	}
}